

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

int __thiscall testing::TestSuite::skipped_test_count(TestSuite *this)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  pointer ppTVar4;
  
  ppTVar4 = (this->test_info_list_).
            super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppTVar4 ==
      (this->test_info_list_).
      super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    iVar3 = 0;
  }
  else {
    iVar3 = 0;
    do {
      uVar2 = 0;
      if ((*ppTVar4)->should_run_ == true) {
        bVar1 = TestResult::Skipped(&(*ppTVar4)->result_);
        uVar2 = (uint)bVar1;
      }
      iVar3 = iVar3 + uVar2;
      ppTVar4 = ppTVar4 + 1;
    } while (ppTVar4 !=
             (this->test_info_list_).
             super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  return iVar3;
}

Assistant:

TestPartResultReporterInterface*
UnitTestImpl::GetGlobalTestPartResultReporter() {
  internal::MutexLock lock(&global_test_part_result_reporter_mutex_);
  return global_test_part_result_reporter_;
}